

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrowRef(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  if (type.id == 1) {
    pEVar1 = make(this,(Type)0x4a);
    pEVar2 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x18,8);
    pEVar2->_id = ThrowRefId;
    (pEVar2->type).id = 0;
    *(Expression **)(pEVar2 + 1) = pEVar1;
    wasm::ThrowRef::finalize();
    return pEVar2;
  }
  __assert_fail("type == Type::unreachable",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1458,"Expression *wasm::TranslateToFuzzReader::makeThrowRef(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeThrowRef(Type type) {
  assert(type == Type::unreachable);
  // Use a nullable type here to avoid the risk of trapping (when we find no way
  // to make a non-nullable ref, we end up fixing validation with
  // ref.as_non_null of a null, which validates but traps).
  auto* ref = make(Type(HeapType::exn, Nullable));
  return builder.makeThrowRef(ref);
}